

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

aiImporterDesc * aiGetImporterDesc(char *extension)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  size_t __n;
  aiImporterDesc *paVar2;
  ulong uVar3;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> out;
  vector<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_> local_38;
  undefined4 extraout_var_00;
  
  if (extension == (char *)0x0) {
    paVar2 = (aiImporterDesc *)0x0;
  }
  else {
    local_38.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Assimp::GetImporterInstanceList(&local_38);
    if (local_38.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_38.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar2 = (aiImporterDesc *)0x0;
    }
    else {
      paVar2 = (aiImporterDesc *)0x0;
      uVar3 = 0;
      do {
        iVar1 = (*local_38.
                  super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3]->_vptr_BaseImporter[5])();
        __s1 = *(char **)(CONCAT44(extraout_var,iVar1) + 0x38);
        __n = strlen(extension);
        iVar1 = strncmp(__s1,extension,__n);
        if (iVar1 == 0) {
          iVar1 = (*local_38.
                    super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar3]->_vptr_BaseImporter[5])();
          paVar2 = (aiImporterDesc *)CONCAT44(extraout_var_00,iVar1);
          break;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)((long)local_38.
                                     super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_38.
                                     super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    Assimp::DeleteImporterInstanceList(&local_38);
    if (local_38.super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return paVar2;
}

Assistant:

ASSIMP_API C_STRUCT const aiImporterDesc* aiGetImporterDesc( const char *extension ) {
    if( NULL == extension ) {
        return NULL;
    }
    const aiImporterDesc *desc( NULL );
    std::vector< BaseImporter* > out;
    GetImporterInstanceList( out );
    for( size_t i = 0; i < out.size(); ++i ) {
        if( 0 == strncmp( out[ i ]->GetInfo()->mFileExtensions, extension, strlen( extension ) ) ) {
            desc = out[ i ]->GetInfo();
            break;
        }
    }

    DeleteImporterInstanceList(out);

    return desc;
}